

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_snap_functions.cc
# Opt level: O0

void __thiscall
s2builderutil::IntLatLngSnapFunction::set_snap_radius
          (IntLatLngSnapFunction *this,S1Angle snap_radius)

{
  bool bVar1;
  int exponent;
  ostream *poVar2;
  S2LogMessage local_80;
  S2LogMessageVoidify local_69;
  double local_68;
  S1Angle local_60;
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  double local_28;
  S1Angle local_20;
  IntLatLngSnapFunction *local_18;
  IntLatLngSnapFunction *this_local;
  S1Angle snap_radius_local;
  
  local_20.radians_ = snap_radius.radians_;
  local_18 = this;
  this_local = (IntLatLngSnapFunction *)snap_radius.radians_;
  exponent = IntLatLngSnapFunction::exponent(this);
  local_28 = (double)MinSnapRadiusForExponent(exponent);
  bVar1 = operator>=(local_20,(S1Angle)local_28);
  local_41 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xed,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar2 = S2LogMessage::stream(&local_40);
    poVar2 = std::operator<<(poVar2,
                             "Check failed: (snap_radius) >= (MinSnapRadiusForExponent(exponent())) "
                            );
    S2LogMessageVoidify::operator&(&local_29,poVar2);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  local_60.radians_ = (double)this_local;
  local_68 = (double)S2Builder::SnapFunction::kMaxSnapRadius();
  bVar1 = operator<=(local_60,(S1Angle)local_68);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2builderutil_snap_functions.cc"
               ,0xee,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_80);
    poVar2 = std::operator<<(poVar2,"Check failed: (snap_radius) <= (kMaxSnapRadius()) ");
    S2LogMessageVoidify::operator&(&local_69,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
  }
  (this->snap_radius_).radians_ = (double)this_local;
  return;
}

Assistant:

void IntLatLngSnapFunction::set_snap_radius(S1Angle snap_radius) {
  S2_DCHECK_GE(snap_radius, MinSnapRadiusForExponent(exponent()));
  S2_DCHECK_LE(snap_radius, kMaxSnapRadius());
  snap_radius_ = snap_radius;
}